

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_action.cpp
# Opt level: O0

int AF_AActor_A_DeQueueCorpse
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  DCorpsePointer *pDVar1;
  bool bVar2;
  bool local_63;
  DCorpsePointer *corpsePtr;
  TThinkerIterator<DCorpsePointer> iterator;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_shared/a_action.cpp"
                  ,0x142,
                  "int AF_AActor_A_DeQueueCorpse(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar2 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar2 = true, (param->field_0).field_1.atag != 1)) {
    bVar2 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar2) {
    iterator.super_FThinkerIterator._16_8_ = *(undefined8 *)&param->field_0;
    local_63 = true;
    if ((DObject *)iterator.super_FThinkerIterator._16_8_ != (DObject *)0x0) {
      local_63 = DObject::IsKindOf((DObject *)iterator.super_FThinkerIterator._16_8_,
                                   AActor::RegistrationInfo.MyClass);
    }
    if (local_63 != false) {
      TThinkerIterator<DCorpsePointer>::TThinkerIterator
                ((TThinkerIterator<DCorpsePointer> *)&corpsePtr,3);
      do {
        pDVar1 = TThinkerIterator<DCorpsePointer>::Next
                           ((TThinkerIterator<DCorpsePointer> *)&corpsePtr,false);
        if (pDVar1 == (DCorpsePointer *)0x0) {
          return 0;
        }
        bVar2 = TObjPtr<AActor>::operator==
                          (&pDVar1->Corpse,(AActor *)iterator.super_FThinkerIterator._16_8_);
      } while (!bVar2);
      TObjPtr<AActor>::operator=(&pDVar1->Corpse,(AActor *)0x0);
      (*(pDVar1->super_DThinker).super_DObject._vptr_DObject[4])();
      return 0;
    }
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_shared/a_action.cpp"
                  ,0x142,
                  "int AF_AActor_A_DeQueueCorpse(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_shared/a_action.cpp"
                ,0x142,
                "int AF_AActor_A_DeQueueCorpse(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
  ;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_DeQueueCorpse)
{
	PARAM_SELF_PROLOGUE(AActor);

	TThinkerIterator<DCorpsePointer> iterator (STAT_CORPSEPOINTER);
	DCorpsePointer *corpsePtr;

	while ((corpsePtr = iterator.Next()) != NULL)
	{
		if (corpsePtr->Corpse == self)
		{
			corpsePtr->Corpse = NULL;
			corpsePtr->Destroy ();
			return 0;
		}
	}
	return 0;
}